

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration.c
# Opt level: O2

int registration_service_start(registration_service_handle *rs,proxy_conf *conf)

{
  undefined8 *puVar1;
  undefined1 uVar2;
  char *pcVar3;
  int iVar4;
  uint len;
  size_t sVar5;
  uint8_t *data;
  char *__s;
  uint8_t digest [16];
  
  __s = "";
  if (conf->public_addr != (char *)0x0) {
    __s = conf->public_addr;
  }
  if (conf->reg_name == (char *)0x0) {
    return 0;
  }
  puVar1 = (undefined8 *)rs->priv;
  mutex_lock((mutex_handle *)(puVar1 + 4));
  iVar4 = strcmp(conf->password,"PUBLIC");
  uVar2 = 0x4e;
  if (iVar4 == 0) {
    uVar2 = 0x59;
  }
  *(undefined1 *)(puVar1 + 3) = uVar2;
  pcVar3 = conf->reg_comment;
  *puVar1 = conf->reg_name;
  puVar1[1] = pcVar3;
  free((void *)puVar1[2]);
  sVar5 = strlen(__s);
  data = (uint8_t *)malloc(sVar5 + 0x39);
  if (data == (uint8_t *)0x0) {
    len = 0xfffffff4;
  }
  else {
    len = sprintf((char *)data,"%s%s%s",*puVar1,__s,"#5A!zu");
    if ((int)len < 0) goto LAB_00106a14;
    digest_get(data,len,digest);
    len = sprintf((char *)data,"&a=%s&d=",__s);
    if ((int)len < 0) goto LAB_00106a14;
    digest_to_str(digest,(char *)(data + len));
    len = sprintf((char *)(data + (ulong)len + 0x20),"&p=%d&v=%s",(ulong)conf->port,"1.2.3o");
    if ((int)len < 0) goto LAB_00106a14;
    puVar1[2] = data;
    len = worker_start((worker_handle *)(puVar1 + 5));
    if (((-1 < (int)len) && (len = worker_wake((worker_handle *)(puVar1 + 5)), -1 < (int)len)) &&
       (*(int *)(puVar1 + 0xb) == 3)) {
      *(undefined4 *)(puVar1 + 0xb) = 0;
    }
  }
  data = (uint8_t *)0x0;
LAB_00106a14:
  mutex_unlock((mutex_handle *)(puVar1 + 4));
  free(data);
  return len;
}

Assistant:

int registration_service_start(struct registration_service_handle *rs,
			       const struct proxy_conf *conf)
{
	struct registration_service_priv *priv = rs->priv;
	char *reg_suffix = NULL;
	uint8_t digest[DIGEST_LEN];
	const char *public_addr = conf->public_addr == NULL ?
				   "" : conf->public_addr;
	int ret;

	if (conf->reg_name == NULL)
		return 0;

	mutex_lock(&priv->mutex);

	priv->public = strcmp(conf->password, "PUBLIC") == 0 ? 'Y' : 'N';

	priv->reg_name = conf->reg_name;
	priv->reg_comment = conf->reg_comment;

	if (priv->reg_suffix != NULL)
		free((void *)priv->reg_suffix);
	reg_suffix = malloc(strlen(public_addr) + (2 * DIGEST_LEN) +
			    sizeof(protocol_version) + 18);
	if (reg_suffix == NULL) {
		ret = -ENOMEM;
		goto registration_service_start_end;
	}

	ret = sprintf(reg_suffix, "%s%s%s", priv->reg_name, public_addr,
		      digest_salt);
	if (ret < 0)
		goto registration_service_start_end;

	digest_get((uint8_t *)reg_suffix, ret, digest);

	ret = sprintf(reg_suffix, "&a=%s&d=", public_addr);
	if (ret < 0)
		goto registration_service_start_end;

	digest_to_str(digest, &reg_suffix[ret]);

	ret = sprintf(&reg_suffix[ret + (2 * DIGEST_LEN)],
		      "&p=%d&v=%s", conf->port, protocol_version);
	if (ret < 0)
		goto registration_service_start_end;

	priv->reg_suffix = reg_suffix;
	reg_suffix = NULL;

	ret = worker_start(&priv->worker);
	if (ret < 0)
		goto registration_service_start_end;

	ret = worker_wake(&priv->worker);
	if (ret < 0)
		goto registration_service_start_end;

	if (priv->status == REGISTRATION_STATUS_OFF)
		priv->status = REGISTRATION_STATUS_UNKNOWN;

registration_service_start_end:
	mutex_unlock(&priv->mutex);

	free(reg_suffix);

	return ret;
}